

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::setLayoutQualifier
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TString *id)

{
  EShLanguage EVar1;
  size_type sVar2;
  pointer pcVar3;
  TIntermediate *pTVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  size_type sVar12;
  undefined **ppuVar13;
  long lVar14;
  _func_int *UNRECOVERED_JUMPTABLE;
  TBlendEquationShift be;
  uint uVar15;
  TInterlockOrdering TVar16;
  TBlendEquationShift e;
  int *piVar17;
  uint uVar18;
  TLayoutDepth TVar19;
  TLayoutStencil TVar20;
  bool bVar21;
  
  sVar2 = id->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (id->_M_dataplus)._M_p;
    sVar12 = 0;
    do {
      iVar6 = tolower((int)pcVar3[sVar12]);
      pcVar3[sVar12] = (char)iVar6;
      sVar12 = sVar12 + 1;
    } while (sVar2 != sVar12);
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"column_major");
  if (iVar6 == 0) {
    uVar9 = *(ulong *)&(publicType->qualifier).field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
LAB_004311cb:
    *(ulong *)&(publicType->qualifier).field_0x8 = uVar9;
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"row_major");
  if (iVar6 == 0) {
    uVar9 = (*(ulong *)&(publicType->qualifier).field_0x8 & 0x1fffffffffffffff) + 0x2000000000000000
    ;
    goto LAB_004311cb;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"packed");
  if (iVar6 == 0) {
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed != false) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x28])
                (this,loc,"packed");
    }
    bVar5 = (publicType->qualifier).field_0x10 & 0xf0 | 4;
LAB_004312ef:
    (publicType->qualifier).field_0x10 = bVar5;
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"shared");
  if (iVar6 == 0) {
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed != false) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x28])
                (this,loc,"shared");
    }
    bVar5 = ((publicType->qualifier).field_0x10 & 0xf0) + 1;
    goto LAB_004312ef;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"std140");
  if (iVar6 == 0) {
    bVar5 = (publicType->qualifier).field_0x10 & 0xf0 | 2;
    goto LAB_004312ef;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"std430");
  if (iVar6 == 0) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"std430");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1ae,"GL_ARB_shader_storage_buffer_object","std430");
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,0x136,(char *)0x0,"std430");
    bVar5 = (publicType->qualifier).field_0x10 & 0xf0 | 3;
    goto LAB_004312ef;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"scalar");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"scalar");
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_scalar_block_layout,"scalar block layout");
    bVar5 = (publicType->qualifier).field_0x10 & 0xf0 | 5;
    goto LAB_004312ef;
  }
  uVar15 = 1;
  pcVar8 = TQualifier::getLayoutFormatString(ElfRgba32f);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,pcVar8);
  uVar7 = 0;
  if (iVar6 != 0) {
    do {
      uVar18 = uVar7;
      if (uVar18 == 0x33) goto LAB_00430fe7;
      pcVar8 = TQualifier::getLayoutFormatString(uVar18 + ElfRgba16f);
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,pcVar8);
      uVar7 = uVar18 + 1;
    } while (iVar6 != 0);
    uVar15 = uVar18 + 2;
    uVar7 = (uint)(0x33 < uVar18 + 1);
  }
  if (((0x27 < uVar15) || (uVar15 - 7 < 0xf)) || (uVar15 - 0x1c < 6)) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,7,"image load-store format");
  }
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,7,0x1a4,"GL_ARB_shader_image_load_store","image load store")
  ;
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,8,0x136,"GL_ARB_shader_image_load_store","image load store")
  ;
  (publicType->qualifier).field_0x2c = (char)uVar15;
  if ((char)uVar7 == '\0') {
    return;
  }
LAB_00430fe7:
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"push_constant");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"push_constant");
    (publicType->qualifier).layoutPushConstant = true;
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"buffer_reference");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"buffer_reference");
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_buffer_reference,"buffer_reference");
    (publicType->qualifier).layoutBufferReference = true;
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar4->useStorageBuffer = true;
    pTVar4->usePhysicalStorageBuffer = true;
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"bindless_sampler");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bindless_sampler");
    (publicType->qualifier).layoutBindlessSampler = true;
    lVar14 = 0x528;
LAB_004313c5:
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                            *)((long)&((this->super_TParseContextBase).super_TParseVersions.
                                      intermediate)->language + lVar14),&this->currentCaller);
    *pmVar10 = AstRefTypeLayout;
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"bindless_image");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bindless_image");
    (publicType->qualifier).layoutBindlessImage = true;
    lVar14 = 0x558;
    goto LAB_004313c5;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"bound_sampler");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bound_sampler");
    (publicType->qualifier).layoutBindlessSampler = false;
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"bound_image");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bound_image");
    (publicType->qualifier).layoutBindlessImage = false;
    return;
  }
  EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((EVar1 < EShLangCount) && ((0x200cU >> (EVar1 & 0x1f) & 1) != 0)) {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"triangles");
    if (iVar6 == 0) {
LAB_00431620:
      (publicType->shaderQualifiers).geometry = ElgTriangles;
      return;
    }
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar1 == EShLangTessEvaluation) {
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"triangles");
      if (iVar6 == 0) goto LAB_00431620;
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"quads");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).geometry = ElgQuads;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"isolines");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).geometry = ElgIsolines;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"equal_spacing");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).spacing = EvsEqual;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"fractional_even_spacing");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).spacing = EvsFractionalEven;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"fractional_odd_spacing");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).spacing = EvsFractionalOdd;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"cw");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).order = EvoCw;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"ccw");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).order = EvoCcw;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"point_mode");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).pointMode = true;
        return;
      }
    }
    else {
      if ((EVar1 != EShLangMesh) && (EVar1 != EShLangGeometry)) {
        __assert_fail("language == EShLangTessEvaluation",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                      ,0x17db,
                      "void glslang::TParseContext::setLayoutQualifier(const TSourceLoc &, TPublicType &, TString &)"
                     );
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"points");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).geometry = ElgPoints;
        return;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"lines");
      if (iVar6 == 0) {
        (publicType->shaderQualifiers).geometry = ElgLines;
        return;
      }
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"line_strip");
        if (iVar6 == 0) {
          (publicType->shaderQualifiers).geometry = ElgLineStrip;
          return;
        }
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"lines_adjacency");
        if (iVar6 == 0) {
          (publicType->shaderQualifiers).geometry = ElgLinesAdjacency;
          return;
        }
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"triangles_adjacency");
        if (iVar6 == 0) {
          (publicType->shaderQualifiers).geometry = ElgTrianglesAdjacency;
          return;
        }
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"triangle_strip");
        if (iVar6 == 0) {
          (publicType->shaderQualifiers).geometry = ElgTriangleStrip;
          return;
        }
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"passthrough");
        if (iVar6 == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                    (this,loc,1,&E_SPV_NV_geometry_shader_passthrough,"geometry shader passthrough")
          ;
          (publicType->qualifier).layoutPassthrough = true;
          ((this->super_TParseContextBase).super_TParseVersions.intermediate)->geoPassthroughEXT =
               true;
          return;
        }
      }
    }
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"origin_upper_left");
    if (iVar6 == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,7,"origin_upper_left");
      if ((this->super_TParseContextBase).super_TParseVersions.profile == ENoProfile) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x8c,"GL_ARB_fragment_coord_conventions",
                   "origin_upper_left");
      }
      (publicType->shaderQualifiers).originUpperLeft = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"pixel_center_integer");
    if (iVar6 == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,7,"pixel_center_integer");
      if ((this->super_TParseContextBase).super_TParseVersions.profile == ENoProfile) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x8c,"GL_ARB_fragment_coord_conventions",
                   "pixel_center_integer");
      }
      (publicType->shaderQualifiers).pixelCenterInteger = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"early_fragment_tests");
    if (iVar6 == 0) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,7,0x1a4,"GL_ARB_shader_image_load_store",
                 "early_fragment_tests");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"early_fragment_tests");
      (publicType->shaderQualifiers).earlyFragmentTests = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"early_and_late_fragment_tests_amd");
    if (iVar6 == 0) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,7,0x1a4,"GL_AMD_shader_early_and_late_fragment_tests",
                 "early_and_late_fragment_tests_amd");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"early_and_late_fragment_tests_amd")
      ;
      (publicType->shaderQualifiers).earlyAndLateFragmentTestsAMD = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"post_depth_coverage");
    if (iVar6 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,2,post_depth_coverageEXTs,"post depth coverage");
      iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_ARB_post_depth_coverage");
      if ((char)iVar6 != '\0') {
        (publicType->shaderQualifiers).earlyFragmentTests = true;
      }
      (publicType->shaderQualifiers).postDepthCoverage = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"non_coherent_color_attachment_readext");
    if (iVar6 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_shader_tile_image,"non_coherent_color_attachment_readEXT");
      (publicType->shaderQualifiers).nonCoherentColorAttachmentReadEXT = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"non_coherent_depth_attachment_readext");
    if (iVar6 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_shader_tile_image,"non_coherent_depth_attachment_readEXT");
      (publicType->shaderQualifiers).nonCoherentDepthAttachmentReadEXT = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"non_coherent_stencil_attachment_readext");
    if (iVar6 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_shader_tile_image,"non_coherent_stencil_attachment_readEXT");
      (publicType->shaderQualifiers).nonCoherentStencilAttachmentReadEXT = true;
      return;
    }
    TVar19 = EldAny;
    piVar17 = &DAT_00748660;
    bVar21 = false;
    do {
      pcVar8 = "none";
      if (TVar19 < EldCount) {
        pcVar8 = (char *)((long)&DAT_00748660 + (long)*piVar17);
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,pcVar8);
      if (iVar6 == 0) {
        TParseVersions::requireProfile((TParseVersions *)this,loc,6,"depth layout qualifier");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x1a4,(char *)0x0,"depth layout qualifier");
        (publicType->shaderQualifiers).layoutDepth = TVar19;
        if (!bVar21) {
          return;
        }
        break;
      }
      bVar21 = EldLess < TVar19;
      TVar19 = TVar19 + EldAny;
      piVar17 = piVar17 + 1;
    } while (TVar19 != EldCount);
    TVar20 = ElsRefUnchangedFrontAMD;
    piVar17 = &DAT_00748670;
    bVar21 = false;
    do {
      pcVar8 = "none";
      if (TVar20 < ElsCount) {
        pcVar8 = (char *)((long)&DAT_00748670 + (long)*piVar17);
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,pcVar8);
      if (iVar6 == 0) {
        TParseVersions::requireProfile((TParseVersions *)this,loc,6,"stencil layout qualifier");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x1a4,(char *)0x0,"stencil layout qualifier");
        (publicType->shaderQualifiers).layoutStencil = TVar20;
        if (!bVar21) {
          return;
        }
        break;
      }
      bVar21 = ElsRefGreaterBackAMD < TVar20;
      TVar20 = TVar20 + ElsRefUnchangedFrontAMD;
      piVar17 = piVar17 + 1;
    } while (TVar20 != ElsCount);
    TVar16 = EioPixelInterlockOrdered;
    ppuVar13 = &PTR_anon_var_dwarf_bf668e_00942e98;
    bVar21 = false;
    do {
      pcVar8 = "none";
      if (TVar16 < EioCount) {
        pcVar8 = *ppuVar13;
      }
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,pcVar8);
      if (iVar6 == 0) {
        TParseVersions::requireProfile
                  ((TParseVersions *)this,loc,6,"fragment shader interlock layout qualifier");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x1c2,(char *)0x0,
                   "fragment shader interlock layout qualifier");
        if (TVar16 < EioCount) {
          pcVar8 = *ppuVar13;
        }
        else {
          pcVar8 = "none";
        }
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,1,&E_GL_ARB_fragment_shader_interlock,pcVar8);
        if (TVar16 - EioShadingRateInterlockOrdered < 2) {
          if (TVar16 < EioCount) {
            pcVar8 = *ppuVar13;
          }
          else {
            pcVar8 = "none";
          }
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                    (this,loc,1,&E_GL_NV_shading_rate_image,pcVar8);
        }
        (publicType->shaderQualifiers).interlockOrdering = TVar16;
        if (!bVar21) {
          return;
        }
        break;
      }
      bVar21 = EioShadingRateInterlockOrdered < TVar16;
      TVar16 = TVar16 + EioPixelInterlockOrdered;
      ppuVar13 = ppuVar13 + 1;
    } while (TVar16 != EioCount);
    e = EBlendMultiply;
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,0,0xd,"blend_support");
    if (iVar6 == 0) {
      do {
        pcVar8 = TQualifier::getBlendEquationString(e);
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,pcVar8);
        if (iVar6 == 0) {
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,8,0x140,"GL_KHR_blend_equation_advanced",
                     "blend equation");
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,-9,0,"GL_KHR_blend_equation_advanced",
                     "blend equation");
          piVar17 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                     blendEquations;
          *piVar17 = *piVar17 | 1 << ((byte)e & 0x1f);
          (publicType->shaderQualifiers).blendEquation = true;
          return;
        }
        e = e + EBlendScreen;
      } while (e != EBlendCount);
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar11 = "unknown blend equation";
      pcVar8 = "blend_support";
      goto LAB_00431c15;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"override_coverage");
    if (iVar6 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_NV_sample_mask_override_coverage,"sample mask override coverage");
      (publicType->shaderQualifiers).layoutOverrideCoverage = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"full_quads");
    if (iVar6 == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"full_quads qualifier");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x8c,"GL_EXT_shader_quad_control",
                 "full_quads qualifier");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,"GL_EXT_shader_quad_control",
                 "full_quads qualifier");
      (publicType->qualifier).layoutFullQuads = true;
      return;
    }
  }
  EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar1 - EShLangRayGen < 6) {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"shaderrecordnv");
    if ((iVar6 == 0) ||
       (iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"shaderrecordext"), iVar6 == 0)) {
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"shaderrecordnv");
      if (iVar6 == 0) {
        ppuVar13 = &E_GL_NV_ray_tracing;
        pcVar8 = "shader record NV";
      }
      else {
        ppuVar13 = &E_GL_EXT_ray_tracing;
        pcVar8 = "shader record EXT";
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,ppuVar13,pcVar8);
      (publicType->qualifier).layoutShaderRecord = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"hitobjectshaderrecordnv");
    if (iVar6 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_NV_shader_invocation_reorder,"hitobject shader record NV");
      (publicType->qualifier).layoutHitObjectShaderRecordNV = true;
      return;
    }
  }
  else if ((EVar1 < EShLangFragment) &&
          (iVar6 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(id,"viewport_relative"), iVar6 == 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_NV_viewport_array2,"view port array2");
    (publicType->qualifier).layoutViewportRelative = true;
    return;
  }
  if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangCompute) &&
     (iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,0,0x11,"derivative_group_"), iVar6 == 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_NV_compute_shader_derivatives,"compute shader derivatives");
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"derivative_group_quadsnv");
    if (iVar6 == 0) {
      (publicType->shaderQualifiers).layoutDerivativeGroupQuads = true;
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"derivative_group_linearnv");
    if (iVar6 == 0) {
      (publicType->shaderQualifiers).layoutDerivativeGroupLinear = true;
      return;
    }
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"primitive_culling");
  if (iVar6 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_ray_flags_primitive_culling,"primitive culling");
    (publicType->shaderQualifiers).layoutPrimitiveCulling = true;
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"quad_derivatives");
  if (iVar6 == 0) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"quad_derivatives qualifier");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x8c,"GL_EXT_shader_quad_control",
               "quad_derivatives qualifier");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,0x136,"GL_EXT_shader_quad_control",
               "quad_derivatives qualifier");
    (publicType->qualifier).layoutQuadDeriv = true;
    return;
  }
  pcVar8 = (id->_M_dataplus)._M_p;
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar11 = "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)";
LAB_00431c15:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar11,pcVar8,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::setLayoutQualifier(const TSourceLoc& loc, TPublicType& publicType, TString& id)
{
    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == TQualifier::getLayoutMatrixString(ElmColumnMajor)) {
        publicType.qualifier.layoutMatrix = ElmColumnMajor;
        return;
    }
    if (id == TQualifier::getLayoutMatrixString(ElmRowMajor)) {
        publicType.qualifier.layoutMatrix = ElmRowMajor;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpPacked)) {
        if (spvVersion.spv != 0) {
            if (spvVersion.vulkanRelaxed)
                return; // silently ignore qualifier
            else
                spvRemoved(loc, "packed");
        }
        publicType.qualifier.layoutPacking = ElpPacked;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpShared)) {
        if (spvVersion.spv != 0) {
            if (spvVersion.vulkanRelaxed)
                return; // silently ignore qualifier
            else
                spvRemoved(loc, "shared");
        }
        publicType.qualifier.layoutPacking = ElpShared;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpStd140)) {
        publicType.qualifier.layoutPacking = ElpStd140;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpStd430)) {
        requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, "std430");
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 430, E_GL_ARB_shader_storage_buffer_object, "std430");
        profileRequires(loc, EEsProfile, 310, nullptr, "std430");
        publicType.qualifier.layoutPacking = ElpStd430;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpScalar)) {
        requireVulkan(loc, "scalar");
        requireExtensions(loc, 1, &E_GL_EXT_scalar_block_layout, "scalar block layout");
        publicType.qualifier.layoutPacking = ElpScalar;
        return;
    }
    // TODO: compile-time performance: may need to stop doing linear searches
    for (TLayoutFormat format = (TLayoutFormat)(ElfNone + 1); format < ElfCount; format = (TLayoutFormat)(format + 1)) {
        if (id == TQualifier::getLayoutFormatString(format)) {
            if ((format > ElfEsFloatGuard && format < ElfFloatGuard) ||
                (format > ElfEsIntGuard && format < ElfIntGuard) ||
                (format > ElfEsUintGuard && format < ElfCount))
                requireProfile(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, "image load-store format");
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_ARB_shader_image_load_store, "image load store");
            profileRequires(loc, EEsProfile, 310, E_GL_ARB_shader_image_load_store, "image load store");
            publicType.qualifier.layoutFormat = format;
            return;
        }
    }
    if (id == "push_constant") {
        requireVulkan(loc, "push_constant");
        publicType.qualifier.layoutPushConstant = true;
        return;
    }
    if (id == "buffer_reference") {
        requireVulkan(loc, "buffer_reference");
        requireExtensions(loc, 1, &E_GL_EXT_buffer_reference, "buffer_reference");
        publicType.qualifier.layoutBufferReference = true;
        intermediate.setUseStorageBuffer();
        intermediate.setUsePhysicalStorageBuffer();
        return;
    }
    if (id == "bindless_sampler") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bindless_sampler");
        publicType.qualifier.layoutBindlessSampler = true;
        intermediate.setBindlessTextureMode(currentCaller, AstRefTypeLayout);
        return;
    }
    if (id == "bindless_image") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bindless_image");
        publicType.qualifier.layoutBindlessImage = true;
        intermediate.setBindlessImageMode(currentCaller, AstRefTypeLayout);
        return;
    }
    if (id == "bound_sampler") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bound_sampler");
        publicType.qualifier.layoutBindlessSampler = false;
        return;
    }
    if (id == "bound_image") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bound_image");
        publicType.qualifier.layoutBindlessImage = false;
        return;
    }
    if (language == EShLangGeometry || language == EShLangTessEvaluation || language == EShLangMesh) {
        if (id == TQualifier::getGeometryString(ElgTriangles)) {
            publicType.shaderQualifiers.geometry = ElgTriangles;
            return;
        }
        if (language == EShLangGeometry || language == EShLangMesh) {
            if (id == TQualifier::getGeometryString(ElgPoints)) {
                publicType.shaderQualifiers.geometry = ElgPoints;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLines)) {
                publicType.shaderQualifiers.geometry = ElgLines;
                return;
            }
            if (language == EShLangGeometry) {
                if (id == TQualifier::getGeometryString(ElgLineStrip)) {
                    publicType.shaderQualifiers.geometry = ElgLineStrip;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgLinesAdjacency)) {
                    publicType.shaderQualifiers.geometry = ElgLinesAdjacency;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgTrianglesAdjacency)) {
                    publicType.shaderQualifiers.geometry = ElgTrianglesAdjacency;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgTriangleStrip)) {
                    publicType.shaderQualifiers.geometry = ElgTriangleStrip;
                    return;
                }
                if (id == "passthrough") {
                    requireExtensions(loc, 1, &E_SPV_NV_geometry_shader_passthrough, "geometry shader passthrough");
                    publicType.qualifier.layoutPassthrough = true;
                    intermediate.setGeoPassthroughEXT();
                    return;
                }
            }
        } else {
            assert(language == EShLangTessEvaluation);

            // input primitive
            if (id == TQualifier::getGeometryString(ElgTriangles)) {
                publicType.shaderQualifiers.geometry = ElgTriangles;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgQuads)) {
                publicType.shaderQualifiers.geometry = ElgQuads;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgIsolines)) {
                publicType.shaderQualifiers.geometry = ElgIsolines;
                return;
            }

            // vertex spacing
            if (id == TQualifier::getVertexSpacingString(EvsEqual)) {
                publicType.shaderQualifiers.spacing = EvsEqual;
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalEven)) {
                publicType.shaderQualifiers.spacing = EvsFractionalEven;
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalOdd)) {
                publicType.shaderQualifiers.spacing = EvsFractionalOdd;
                return;
            }

            // triangle order
            if (id == TQualifier::getVertexOrderString(EvoCw)) {
                publicType.shaderQualifiers.order = EvoCw;
                return;
            }
            if (id == TQualifier::getVertexOrderString(EvoCcw)) {
                publicType.shaderQualifiers.order = EvoCcw;
                return;
            }

            // point mode
            if (id == "point_mode") {
                publicType.shaderQualifiers.pointMode = true;
                return;
            }
        }
    }
    if (language == EShLangFragment) {
        if (id == "origin_upper_left") {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile | ENoProfile, "origin_upper_left");
            if (profile == ENoProfile) {
                profileRequires(loc,ECoreProfile | ECompatibilityProfile, 140, E_GL_ARB_fragment_coord_conventions, "origin_upper_left");
            }

            publicType.shaderQualifiers.originUpperLeft = true;
            return;
        }
        if (id == "pixel_center_integer") {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile | ENoProfile, "pixel_center_integer");
            if (profile == ENoProfile) {
                profileRequires(loc,ECoreProfile | ECompatibilityProfile, 140, E_GL_ARB_fragment_coord_conventions, "pixel_center_integer");
            }
            publicType.shaderQualifiers.pixelCenterInteger = true;
            return;
        }
        if (id == "early_fragment_tests") {
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_ARB_shader_image_load_store, "early_fragment_tests");
            profileRequires(loc, EEsProfile, 310, nullptr, "early_fragment_tests");
            publicType.shaderQualifiers.earlyFragmentTests = true;
            return;
        }
        if (id == "early_and_late_fragment_tests_amd") {
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_AMD_shader_early_and_late_fragment_tests, "early_and_late_fragment_tests_amd");
            profileRequires(loc, EEsProfile, 310, nullptr, "early_and_late_fragment_tests_amd");
            publicType.shaderQualifiers.earlyAndLateFragmentTestsAMD = true;
            return;
        }
        if (id == "post_depth_coverage") {
            requireExtensions(loc, Num_post_depth_coverageEXTs, post_depth_coverageEXTs, "post depth coverage");
            if (extensionTurnedOn(E_GL_ARB_post_depth_coverage)) {
                publicType.shaderQualifiers.earlyFragmentTests = true;
            }
            publicType.shaderQualifiers.postDepthCoverage = true;
            return;
        }
        /* id is transformed into lower case in the beginning of this function. */
        if (id == "non_coherent_color_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_color_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentColorAttachmentReadEXT = true;
            return;
        }
        if (id == "non_coherent_depth_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_depth_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentDepthAttachmentReadEXT = true;
            return;
        }
        if (id == "non_coherent_stencil_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_stencil_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentStencilAttachmentReadEXT = true;
            return;
        }
        for (TLayoutDepth depth = (TLayoutDepth)(EldNone + 1); depth < EldCount; depth = (TLayoutDepth)(depth+1)) {
            if (id == TQualifier::getLayoutDepthString(depth)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "depth layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, nullptr, "depth layout qualifier");
                publicType.shaderQualifiers.layoutDepth = depth;
                return;
            }
        }
        for (TLayoutStencil stencil = (TLayoutStencil)(ElsNone + 1); stencil < ElsCount; stencil = (TLayoutStencil)(stencil+1)) {
            if (id == TQualifier::getLayoutStencilString(stencil)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "stencil layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, nullptr, "stencil layout qualifier");
                publicType.shaderQualifiers.layoutStencil = stencil;
                return;
            }
        }
        for (TInterlockOrdering order = (TInterlockOrdering)(EioNone + 1); order < EioCount; order = (TInterlockOrdering)(order+1)) {
            if (id == TQualifier::getInterlockOrderingString(order)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "fragment shader interlock layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 450, nullptr, "fragment shader interlock layout qualifier");
                requireExtensions(loc, 1, &E_GL_ARB_fragment_shader_interlock, TQualifier::getInterlockOrderingString(order));
                if (order == EioShadingRateInterlockOrdered || order == EioShadingRateInterlockUnordered)
                    requireExtensions(loc, 1, &E_GL_NV_shading_rate_image, TQualifier::getInterlockOrderingString(order));
                publicType.shaderQualifiers.interlockOrdering = order;
                return;
            }
        }
        if (id.compare(0, 13, "blend_support") == 0) {
            bool found = false;
            for (TBlendEquationShift be = (TBlendEquationShift)0; be < EBlendCount; be = (TBlendEquationShift)(be + 1)) {
                if (id == TQualifier::getBlendEquationString(be)) {
                    profileRequires(loc, EEsProfile, 320, E_GL_KHR_blend_equation_advanced, "blend equation");
                    profileRequires(loc, ~EEsProfile, 0, E_GL_KHR_blend_equation_advanced, "blend equation");
                    intermediate.addBlendEquation(be);
                    publicType.shaderQualifiers.blendEquation = true;
                    found = true;
                    break;
                }
            }
            if (! found)
                error(loc, "unknown blend equation", "blend_support", "");
            return;
        }
        if (id == "override_coverage") {
            requireExtensions(loc, 1, &E_GL_NV_sample_mask_override_coverage, "sample mask override coverage");
            publicType.shaderQualifiers.layoutOverrideCoverage = true;
            return;
        }
        if (id == "full_quads")
        {
            const char* feature = "full_quads qualifier";
            requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, feature);
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 140, E_GL_EXT_shader_quad_control, feature);
            profileRequires(loc, EEsProfile, 310, E_GL_EXT_shader_quad_control, feature);
            publicType.qualifier.layoutFullQuads = true;
            return;
        }
    }
    if (language == EShLangVertex ||
        language == EShLangTessControl ||
        language == EShLangTessEvaluation ||
        language == EShLangGeometry ) {
        if (id == "viewport_relative") {
            requireExtensions(loc, 1, &E_GL_NV_viewport_array2, "view port array2");
            publicType.qualifier.layoutViewportRelative = true;
            return;
        }
    } else {
        if (language == EShLangRayGen || language == EShLangIntersect ||
        language == EShLangAnyHit || language == EShLangClosestHit ||
        language == EShLangMiss || language == EShLangCallable) {
            if (id == "shaderrecordnv" || id == "shaderrecordext") {
                if (id == "shaderrecordnv") {
                    requireExtensions(loc, 1, &E_GL_NV_ray_tracing, "shader record NV");
                } else {
                    requireExtensions(loc, 1, &E_GL_EXT_ray_tracing, "shader record EXT");
                }
                publicType.qualifier.layoutShaderRecord = true;
                return;
            } else if (id == "hitobjectshaderrecordnv") {
                requireExtensions(loc, 1, &E_GL_NV_shader_invocation_reorder, "hitobject shader record NV");
                publicType.qualifier.layoutHitObjectShaderRecordNV = true;
                return;
            }

        }
    }
    if (language == EShLangCompute) {
        if (id.compare(0, 17, "derivative_group_") == 0) {
            requireExtensions(loc, 1, &E_GL_NV_compute_shader_derivatives, "compute shader derivatives");
            if (id == "derivative_group_quadsnv") {
                publicType.shaderQualifiers.layoutDerivativeGroupQuads = true;
                return;
            } else if (id == "derivative_group_linearnv") {
                publicType.shaderQualifiers.layoutDerivativeGroupLinear = true;
                return;
            }
        }
    }

    if (id == "primitive_culling") {
        requireExtensions(loc, 1, &E_GL_EXT_ray_flags_primitive_culling, "primitive culling");
        publicType.shaderQualifiers.layoutPrimitiveCulling = true;
        return;
    }

    if (id == "quad_derivatives")
    {
        const char* feature = "quad_derivatives qualifier";
        requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, feature);
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 140, E_GL_EXT_shader_quad_control, feature);
        profileRequires(loc, EEsProfile, 310, E_GL_EXT_shader_quad_control, feature);
        publicType.qualifier.layoutQuadDeriv = true;
        return;
    }

    error(loc, "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)", id.c_str(), "");
}